

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O0

void anon_unknown.dwarf_c305a::readWriteTest
               (int channelCount,int testTimes,bool random_channel_data,string *fn)

{
  ostream *poVar1;
  void *this;
  char *__filename;
  int in_ESI;
  int in_EDI;
  Compression compression;
  int compressionIndex;
  int i;
  string *in_stack_00000428;
  undefined1 in_stack_00000433;
  int in_stack_00000434;
  string *in_stack_000006b0;
  undefined1 in_stack_000006bf;
  Compression in_stack_000006c0;
  int in_stack_000006c4;
  int local_1c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
  poVar1 = std::operator<<(poVar1," channels ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
  poVar1 = std::operator<<(poVar1," times.");
  this = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    generateRandomFile(in_stack_000006c4,in_stack_000006c0,(bool)in_stack_000006bf,in_stack_000006b0
                      );
    readFile(in_stack_00000434,(bool)in_stack_00000433,in_stack_00000428);
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
  }
  return;
}

Assistant:

void
readWriteTest (
    int                channelCount,
    int                testTimes,
    bool               random_channel_data,
    const std::string& fn)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;
    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, random_channel_data, fn);
        readFile (channelCount, false, fn);
        remove (fn.c_str ());
    }
}